

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O1

void linker_dynprep(GlobalVars *gv)

{
  byte bVar1;
  DynArg arg;
  int i;
  long lVar2;
  
  hide_shlib_symbols(gv);
  if ((gv->dest_sharedobj != 0) || (gv->dyn_exp_all != 0)) {
    lVar2 = 0;
    do {
      for (arg = (DynArg)((DynArg *)(gv->symbols + lVar2))->sym; arg.name != (char *)0x0;
          arg = (DynArg)(arg.sym)->glob_chain) {
        if ((((1 < (arg.sym)->bind) && (bVar1 = (arg.sym)->flags, (bVar1 & 0x10) == 0)) &&
            ((arg.sym)->relsect != (Section *)0x0)) &&
           ((bVar1 < 0x40 && (((arg.sym)->relsect->obj->flags & 1) != 0)))) {
          (arg.sym)->flags = bVar1 | 0x80;
          dyn_entry(gv,arg,7);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10000);
  }
  if ((gv->dynamic != 0) && (fff[gv->dest_format]->dyncreate != (_func_void_GlobalVars_ptr *)0x0)) {
    (*fff[gv->dest_format]->dyncreate)(gv);
    return;
  }
  return;
}

Assistant:

void linker_dynprep(struct GlobalVars *gv)
/* Preparations for dynamic linking */
{
  /* hide unreferenced symbols from a shared library */
  hide_shlib_symbols(gv);

  /* export all global symbols when creating a shared library */
  if (gv->dest_sharedobj || gv->dyn_exp_all) {
    int i;

    for (i=0; i<SYMHTABSIZE; i++) {
      struct Symbol *sym;
      struct Symbol **chain = &gv->symbols[i];

      while (sym = *chain) {
        if (sym->bind>=SYMB_GLOBAL && !(sym->flags & SYMF_SHLIB) &&
            sym->relsect!=NULL && (sym->relsect->obj->flags & OUF_LINKED))
          dyn_export(gv,sym);
        chain = &sym->glob_chain;
      }
    }
  }

  /* let the target create and populate dynamic sections when needed */
  if (gv->dynamic && fff[gv->dest_format]->dyncreate)
    fff[gv->dest_format]->dyncreate(gv);
}